

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::InstanceIntersectorK<8>_>,_false>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  ulong *puVar1;
  undefined4 uVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  NodeRef nodeRef;
  ulong uVar16;
  byte bVar17;
  ulong *puVar18;
  undefined1 (*pauVar19) [32];
  ulong uVar20;
  ulong uVar21;
  Primitive *prim;
  bool bVar22;
  bool bVar23;
  ulong uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  vbool<8>_conflict valid0;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  vbool<8>_conflict local_274b;
  InstanceIntersectorK<8> local_274a;
  Precalculations local_2749;
  uint local_2748;
  uint local_2744;
  RayK<8> *local_2740;
  ulong local_2738;
  RayK<8> *local_2730;
  ulong local_2728;
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  ulong local_2608 [241];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  local_2608[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2608[0] != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar27 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar32 = ZEXT816(0) << 0x40;
      uVar24 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar32),5);
      uVar20 = vpcmpeqd_avx512vl(auVar27,(undefined1  [32])valid_i->field_0);
      uVar24 = uVar24 & uVar20;
      bVar17 = (byte)uVar24;
      if (bVar17 != 0) {
        auVar27 = *(undefined1 (*) [32])(ray + 0x80);
        auVar30 = *(undefined1 (*) [32])(ray + 0xa0);
        auVar25 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar33._8_4_ = 0x7fffffff;
        auVar33._0_8_ = 0x7fffffff7fffffff;
        auVar33._12_4_ = 0x7fffffff;
        auVar33._16_4_ = 0x7fffffff;
        auVar33._20_4_ = 0x7fffffff;
        auVar33._24_4_ = 0x7fffffff;
        auVar33._28_4_ = 0x7fffffff;
        local_2740 = ray + 0x100;
        auVar26 = vandps_avx(auVar27,auVar33);
        auVar36._8_4_ = 0x219392ef;
        auVar36._0_8_ = 0x219392ef219392ef;
        auVar36._12_4_ = 0x219392ef;
        auVar36._16_4_ = 0x219392ef;
        auVar36._20_4_ = 0x219392ef;
        auVar36._24_4_ = 0x219392ef;
        auVar36._28_4_ = 0x219392ef;
        uVar20 = vcmpps_avx512vl(auVar26,auVar36,1);
        bVar23 = (bool)((byte)uVar20 & 1);
        auVar26._0_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar27._0_4_;
        bVar23 = (bool)((byte)(uVar20 >> 1) & 1);
        auVar26._4_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar27._4_4_;
        bVar23 = (bool)((byte)(uVar20 >> 2) & 1);
        auVar26._8_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar27._8_4_;
        bVar23 = (bool)((byte)(uVar20 >> 3) & 1);
        auVar26._12_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar27._12_4_;
        bVar23 = (bool)((byte)(uVar20 >> 4) & 1);
        auVar26._16_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar27._16_4_;
        bVar23 = (bool)((byte)(uVar20 >> 5) & 1);
        auVar26._20_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar27._20_4_;
        bVar23 = (bool)((byte)(uVar20 >> 6) & 1);
        auVar26._24_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar27._24_4_;
        bVar23 = SUB81(uVar20 >> 7,0);
        auVar26._28_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar27._28_4_;
        auVar27 = vandps_avx(auVar25,auVar33);
        uVar20 = vcmpps_avx512vl(auVar27,auVar36,1);
        bVar23 = (bool)((byte)uVar20 & 1);
        auVar27._0_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar25._0_4_;
        bVar23 = (bool)((byte)(uVar20 >> 1) & 1);
        auVar27._4_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar25._4_4_;
        bVar23 = (bool)((byte)(uVar20 >> 2) & 1);
        auVar27._8_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar25._8_4_;
        bVar23 = (bool)((byte)(uVar20 >> 3) & 1);
        auVar27._12_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar25._12_4_;
        bVar23 = (bool)((byte)(uVar20 >> 4) & 1);
        auVar27._16_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar25._16_4_;
        bVar23 = (bool)((byte)(uVar20 >> 5) & 1);
        auVar27._20_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar25._20_4_;
        bVar23 = (bool)((byte)(uVar20 >> 6) & 1);
        auVar27._24_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar25._24_4_;
        bVar23 = SUB81(uVar20 >> 7,0);
        auVar27._28_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar25._28_4_;
        auVar25 = vrcp14ps_avx512vl(auVar26);
        auVar38._8_4_ = 0x3f800000;
        auVar38._0_8_ = &DAT_3f8000003f800000;
        auVar38._12_4_ = 0x3f800000;
        auVar38._16_4_ = 0x3f800000;
        auVar38._20_4_ = 0x3f800000;
        auVar38._24_4_ = 0x3f800000;
        auVar38._28_4_ = 0x3f800000;
        auVar13 = vfnmadd213ps_fma(auVar26,auVar25,auVar38);
        auVar26 = vrcp14ps_avx512vl(auVar27);
        auVar14 = vfnmadd213ps_fma(auVar27,auVar26,auVar38);
        local_1e80._8_4_ = 0x7f800000;
        local_1e80._0_8_ = 0x7f8000007f800000;
        local_1e80._12_4_ = 0x7f800000;
        local_1e80._16_4_ = 0x7f800000;
        local_1e80._20_4_ = 0x7f800000;
        local_1e80._24_4_ = 0x7f800000;
        local_1e80._28_4_ = 0x7f800000;
        auVar46 = ZEXT3264(local_1e80);
        auVar27 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),ZEXT1632(auVar32));
        local_1e60._0_4_ =
             (uint)(bVar17 & 1) * auVar27._0_4_ | (uint)!(bool)(bVar17 & 1) * 0x7f800000;
        bVar23 = (bool)((byte)(uVar24 >> 1) & 1);
        local_1e60._4_4_ = (uint)bVar23 * auVar27._4_4_ | (uint)!bVar23 * 0x7f800000;
        bVar23 = (bool)((byte)(uVar24 >> 2) & 1);
        local_1e60._8_4_ = (uint)bVar23 * auVar27._8_4_ | (uint)!bVar23 * 0x7f800000;
        bVar23 = (bool)((byte)(uVar24 >> 3) & 1);
        local_1e60._12_4_ = (uint)bVar23 * auVar27._12_4_ | (uint)!bVar23 * 0x7f800000;
        bVar23 = (bool)((byte)(uVar24 >> 4) & 1);
        local_1e60._16_4_ = (uint)bVar23 * auVar27._16_4_ | (uint)!bVar23 * 0x7f800000;
        bVar23 = (bool)((byte)(uVar24 >> 5) & 1);
        local_1e60._20_4_ = (uint)bVar23 * auVar27._20_4_ | (uint)!bVar23 * 0x7f800000;
        bVar23 = (bool)((byte)(uVar24 >> 6) & 1);
        local_1e60._24_4_ = (uint)bVar23 * auVar27._24_4_ | (uint)!bVar23 * 0x7f800000;
        bVar23 = SUB81(uVar24 >> 7,0);
        local_1e60._28_4_ = (uint)bVar23 * auVar27._28_4_ | (uint)!bVar23 * 0x7f800000;
        auVar47 = ZEXT3264(local_1e60);
        auVar27 = *(undefined1 (*) [32])ray;
        auVar41._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
        auVar41._8_4_ = auVar27._8_4_ ^ 0x80000000;
        auVar41._12_4_ = auVar27._12_4_ ^ 0x80000000;
        auVar41._16_4_ = auVar27._16_4_ ^ 0x80000000;
        auVar41._20_4_ = auVar27._20_4_ ^ 0x80000000;
        auVar41._24_4_ = auVar27._24_4_ ^ 0x80000000;
        auVar41._28_4_ = auVar27._28_4_ ^ 0x80000000;
        auVar27 = *(undefined1 (*) [32])(ray + 0x40);
        auVar29._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
        auVar29._8_4_ = auVar27._8_4_ ^ 0x80000000;
        auVar29._12_4_ = auVar27._12_4_ ^ 0x80000000;
        auVar29._16_4_ = auVar27._16_4_ ^ 0x80000000;
        auVar29._20_4_ = auVar27._20_4_ ^ 0x80000000;
        auVar29._24_4_ = auVar27._24_4_ ^ 0x80000000;
        auVar29._28_4_ = auVar27._28_4_ ^ 0x80000000;
        auVar27 = vandps_avx(auVar30,auVar33);
        uVar20 = vcmpps_avx512vl(auVar27,auVar36,1);
        bVar23 = (bool)((byte)uVar20 & 1);
        auVar28._0_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar30._0_4_;
        bVar23 = (bool)((byte)(uVar20 >> 1) & 1);
        auVar28._4_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar30._4_4_;
        bVar23 = (bool)((byte)(uVar20 >> 2) & 1);
        auVar28._8_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar30._8_4_;
        bVar23 = (bool)((byte)(uVar20 >> 3) & 1);
        auVar28._12_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar30._12_4_;
        bVar23 = (bool)((byte)(uVar20 >> 4) & 1);
        auVar28._16_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar30._16_4_;
        bVar23 = (bool)((byte)(uVar20 >> 5) & 1);
        auVar28._20_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar30._20_4_;
        bVar23 = (bool)((byte)(uVar20 >> 6) & 1);
        auVar28._24_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar30._24_4_;
        bVar23 = SUB81(uVar20 >> 7,0);
        auVar28._28_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar30._28_4_;
        auVar27 = vrcp14ps_avx512vl(auVar28);
        auVar15 = vfnmadd213ps_fma(auVar28,auVar27,auVar38);
        auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar27,auVar27);
        auVar44 = ZEXT1664(auVar15);
        auVar48 = ZEXT3264(CONCAT428(0xff800000,
                                     CONCAT424(0xff800000,
                                               CONCAT420(0xff800000,
                                                         CONCAT416(0xff800000,
                                                                   CONCAT412(0xff800000,
                                                                             CONCAT48(0xff800000,
                                                                                                                                                                            
                                                  0xff800000ff800000)))))));
        auVar27 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar32));
        bVar23 = (bool)((byte)(uVar24 >> 1) & 1);
        bVar22 = (bool)((byte)(uVar24 >> 2) & 1);
        bVar4 = (bool)((byte)(uVar24 >> 3) & 1);
        bVar5 = (bool)((byte)(uVar24 >> 4) & 1);
        bVar6 = (bool)((byte)(uVar24 >> 5) & 1);
        bVar7 = (bool)((byte)(uVar24 >> 6) & 1);
        bVar9 = SUB81(uVar24 >> 7,0);
        auVar49 = ZEXT3264(CONCAT428((uint)bVar9 * auVar27._28_4_ | (uint)!bVar9 * -0x800000,
                                     CONCAT424((uint)bVar7 * auVar27._24_4_ |
                                               (uint)!bVar7 * -0x800000,
                                               CONCAT420((uint)bVar6 * auVar27._20_4_ |
                                                         (uint)!bVar6 * -0x800000,
                                                         CONCAT416((uint)bVar5 * auVar27._16_4_ |
                                                                   (uint)!bVar5 * -0x800000,
                                                                   CONCAT412((uint)bVar4 *
                                                                             auVar27._12_4_ |
                                                                             (uint)!bVar4 *
                                                                             -0x800000,
                                                                             CONCAT48((uint)bVar22 *
                                                                                      auVar27._8_4_
                                                                                      | (uint)!
                                                  bVar22 * -0x800000,
                                                  CONCAT44((uint)bVar23 * auVar27._4_4_ |
                                                           (uint)!bVar23 * -0x800000,
                                                           (uint)(bVar17 & 1) * auVar27._0_4_ |
                                                           (uint)!(bool)(bVar17 & 1) * -0x800000))))
                                                  ))));
        auVar32 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar25,auVar25);
        auVar43 = ZEXT1664(auVar32);
        auVar13 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar26,auVar26);
        auVar45 = ZEXT1664(auVar13);
        local_2744 = (uint)(byte)~bVar17;
        puVar18 = local_2608 + 1;
        pauVar19 = (undefined1 (*) [32])local_1e40;
        local_2610 = 0xfffffffffffffff8;
        auVar27 = vmulps_avx512vl(ZEXT1632(auVar32),auVar41);
        auVar50 = ZEXT3264(auVar27);
        auVar42 = ZEXT3264(CONCAT428(*(uint *)(ray + 0x3c) ^ 0x80000000,
                                     CONCAT424(-*(float *)(ray + 0x38) * 0.0,
                                               CONCAT420(-*(float *)(ray + 0x34) * 0.0,
                                                         CONCAT416(-*(float *)(ray + 0x30) * 0.0,
                                                                   CONCAT412(auVar15._12_4_ *
                                                                             -*(float *)(ray + 0x2c)
                                                                             ,CONCAT48(auVar15._8_4_
                                                                                       * -*(float *)
                                                  (ray + 0x28),
                                                  CONCAT44(auVar15._4_4_ * -*(float *)(ray + 0x24),
                                                           auVar15._0_4_ * -*(float *)(ray + 0x20)))
                                                  ))))));
        auVar27 = vmulps_avx512vl(ZEXT1632(auVar13),auVar29);
        auVar51 = ZEXT3264(auVar27);
        local_2730 = ray;
LAB_007ba1af:
        pauVar19 = pauVar19 + -1;
        puVar1 = puVar18 + -1;
        puVar18 = puVar18 + -1;
        bVar23 = true;
        if (*puVar1 != 0xfffffffffffffff8) {
          auVar31 = ZEXT3264(*pauVar19);
          local_26c0 = auVar49._0_32_;
          uVar11 = vcmpps_avx512vl(*pauVar19,local_26c0,1);
          uVar20 = *puVar1;
          if ((char)uVar11 != '\0') {
            do {
              local_2640 = auVar43._0_32_;
              local_26e0 = auVar50._0_32_;
              local_2700 = auVar42._0_32_;
              local_2660 = auVar44._0_32_;
              local_2680 = auVar45._0_32_;
              local_2720 = auVar51._0_32_;
              local_26a0 = auVar47._0_32_;
              if ((uVar20 & 8) != 0) {
                if (uVar20 == 0xfffffffffffffff8) goto LAB_007ba2ea;
                uVar11 = vcmpps_avx512vl(local_26c0,auVar31._0_32_,6);
                if ((char)uVar11 != '\0') {
                  local_2748 = (uint)uVar24;
                  local_274b.v = ~(byte)local_2744;
                  local_2728 = (ulong)((uint)uVar20 & 0xf) - 8;
                  if (local_2728 == 0) goto LAB_007ba3d1;
                  prim = (Primitive *)(uVar20 & 0xfffffffffffffff0);
                  local_2738 = 1;
                  goto LAB_007ba387;
                }
                break;
              }
              auVar31 = ZEXT3264(auVar46._0_32_);
              uVar16 = 0;
              uVar21 = 8;
              do {
                uVar3 = *(ulong *)((uVar20 & 0xfffffffffffffff0) + uVar16 * 8);
                if (uVar3 != 8) {
                  uVar2 = *(undefined4 *)(uVar20 + 0x20 + uVar16 * 4);
                  auVar30._4_4_ = uVar2;
                  auVar30._0_4_ = uVar2;
                  auVar30._8_4_ = uVar2;
                  auVar30._12_4_ = uVar2;
                  auVar30._16_4_ = uVar2;
                  auVar30._20_4_ = uVar2;
                  auVar30._24_4_ = uVar2;
                  auVar30._28_4_ = uVar2;
                  auVar25 = vfmadd132ps_avx512vl(auVar30,local_26e0,local_2640);
                  uVar2 = *(undefined4 *)(uVar20 + 0x40 + uVar16 * 4);
                  auVar34._4_4_ = uVar2;
                  auVar34._0_4_ = uVar2;
                  auVar34._8_4_ = uVar2;
                  auVar34._12_4_ = uVar2;
                  auVar34._16_4_ = uVar2;
                  auVar34._20_4_ = uVar2;
                  auVar34._24_4_ = uVar2;
                  auVar34._28_4_ = uVar2;
                  auVar32 = vfmadd132ps_fma(auVar34,local_2700,local_2660);
                  uVar2 = *(undefined4 *)(uVar20 + 0x60 + uVar16 * 4);
                  auVar35._4_4_ = uVar2;
                  auVar35._0_4_ = uVar2;
                  auVar35._8_4_ = uVar2;
                  auVar35._12_4_ = uVar2;
                  auVar35._16_4_ = uVar2;
                  auVar35._20_4_ = uVar2;
                  auVar35._24_4_ = uVar2;
                  auVar35._28_4_ = uVar2;
                  auVar28 = vfmadd132ps_avx512vl(auVar35,local_2720,local_2680);
                  uVar2 = *(undefined4 *)(uVar20 + 0x30 + uVar16 * 4);
                  auVar37._4_4_ = uVar2;
                  auVar37._0_4_ = uVar2;
                  auVar37._8_4_ = uVar2;
                  auVar37._12_4_ = uVar2;
                  auVar37._16_4_ = uVar2;
                  auVar37._20_4_ = uVar2;
                  auVar37._24_4_ = uVar2;
                  auVar37._28_4_ = uVar2;
                  auVar26 = vfmadd132ps_avx512vl(auVar37,local_26e0,local_2640);
                  uVar2 = *(undefined4 *)(uVar20 + 0x50 + uVar16 * 4);
                  auVar39._4_4_ = uVar2;
                  auVar39._0_4_ = uVar2;
                  auVar39._8_4_ = uVar2;
                  auVar39._12_4_ = uVar2;
                  auVar39._16_4_ = uVar2;
                  auVar39._20_4_ = uVar2;
                  auVar39._24_4_ = uVar2;
                  auVar39._28_4_ = uVar2;
                  auVar15 = vfmadd132ps_fma(auVar39,local_2700,local_2660);
                  uVar2 = *(undefined4 *)(uVar20 + 0x70 + uVar16 * 4);
                  auVar40._4_4_ = uVar2;
                  auVar40._0_4_ = uVar2;
                  auVar40._8_4_ = uVar2;
                  auVar40._12_4_ = uVar2;
                  auVar40._16_4_ = uVar2;
                  auVar40._20_4_ = uVar2;
                  auVar40._24_4_ = uVar2;
                  auVar40._28_4_ = uVar2;
                  auVar29 = vfmadd132ps_avx512vl(auVar40,local_2720,local_2680);
                  auVar27 = vpminsd_avx2(auVar25,auVar26);
                  auVar30 = vpminsd_avx2(ZEXT1632(auVar32),ZEXT1632(auVar15));
                  auVar27 = vpmaxsd_avx2(auVar27,auVar30);
                  auVar30 = vpminsd_avx2(auVar28,auVar29);
                  auVar27 = vpmaxsd_avx2(auVar27,auVar30);
                  auVar30 = vpmaxsd_avx2(auVar25,auVar26);
                  auVar25 = vpmaxsd_avx2(ZEXT1632(auVar32),ZEXT1632(auVar15));
                  auVar26 = vpminsd_avx2(auVar30,auVar25);
                  auVar30 = vpmaxsd_avx2(auVar28,auVar29);
                  auVar25 = vpmaxsd_avx2(auVar27,local_26a0);
                  auVar30 = vpminsd_avx512vl(auVar30,local_26c0);
                  auVar30 = vpminsd_avx2(auVar26,auVar30);
                  uVar12 = vpcmpd_avx512vl(auVar25,auVar30,2);
                  if ((byte)uVar12 != 0) {
                    auVar30 = vblendmps_avx512vl(auVar46._0_32_,auVar27);
                    bVar22 = (bool)((byte)uVar12 & 1);
                    bVar4 = (bool)((byte)(uVar12 >> 1) & 1);
                    bVar5 = (bool)((byte)(uVar12 >> 2) & 1);
                    bVar6 = (bool)((byte)(uVar12 >> 3) & 1);
                    bVar7 = (bool)((byte)(uVar12 >> 4) & 1);
                    bVar9 = (bool)((byte)(uVar12 >> 5) & 1);
                    bVar8 = (bool)((byte)(uVar12 >> 6) & 1);
                    bVar10 = SUB81(uVar12 >> 7,0);
                    if (uVar21 != 8) {
                      *puVar18 = uVar21;
                      puVar18 = puVar18 + 1;
                      *pauVar19 = auVar31._0_32_;
                      pauVar19 = pauVar19 + 1;
                    }
                    auVar31 = ZEXT3264(CONCAT428((uint)bVar10 * auVar30._28_4_ |
                                                 (uint)!bVar10 * auVar27._28_4_,
                                                 CONCAT424((uint)bVar8 * auVar30._24_4_ |
                                                           (uint)!bVar8 * auVar27._24_4_,
                                                           CONCAT420((uint)bVar9 * auVar30._20_4_ |
                                                                     (uint)!bVar9 * auVar27._20_4_,
                                                                     CONCAT416((uint)bVar7 *
                                                                               auVar30._16_4_ |
                                                                               (uint)!bVar7 *
                                                                               auVar27._16_4_,
                                                                               CONCAT412((uint)bVar6
                                                                                         * auVar30.
                                                  _12_4_ | (uint)!bVar6 * auVar27._12_4_,
                                                  CONCAT48((uint)bVar5 * auVar30._8_4_ |
                                                           (uint)!bVar5 * auVar27._8_4_,
                                                           CONCAT44((uint)bVar4 * auVar30._4_4_ |
                                                                    (uint)!bVar4 * auVar27._4_4_,
                                                                    (uint)bVar22 * auVar30._0_4_ |
                                                                    (uint)!bVar22 * auVar27._0_4_)))
                                                  )))));
                    uVar21 = uVar3;
                  }
                }
              } while ((uVar3 != 8) && (bVar22 = uVar16 < 3, uVar16 = uVar16 + 1, bVar22));
              uVar20 = uVar21;
            } while (uVar21 != 8);
          }
          bVar23 = false;
        }
        goto LAB_007ba2ea;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    prim = prim + 1;
    bVar23 = local_2728 <= local_2738;
    local_2738 = local_2738 + 1;
    if (bVar23) break;
LAB_007ba387:
    InstanceIntersectorK<8>::occluded(&local_274a,&local_274b,&local_2749,local_2730,context,prim);
    local_274b.v = local_274b.v & ~(byte)local_274a;
    if (local_274b.v == 0) break;
  }
LAB_007ba3d1:
  bVar17 = (byte)local_2744 | ~local_274b.v;
  local_2744 = CONCAT31((int3)(local_2744 >> 8),bVar17);
  if (bVar17 == 0xff) {
    auVar43 = ZEXT3264(local_2640);
    auVar44 = ZEXT3264(local_2660);
    auVar45 = ZEXT3264(local_2680);
    uVar24 = (ulong)local_2748;
    auVar46 = ZEXT3264(CONCAT428(0x7f800000,
                                 CONCAT424(0x7f800000,
                                           CONCAT420(0x7f800000,
                                                     CONCAT416(0x7f800000,
                                                               CONCAT412(0x7f800000,
                                                                         CONCAT48(0x7f800000,
                                                                                  0x7f8000007f800000
                                                                                 )))))));
    auVar47 = ZEXT3264(local_26a0);
    auVar48 = ZEXT3264(CONCAT428(0xff800000,
                                 CONCAT424(0xff800000,
                                           CONCAT420(0xff800000,
                                                     CONCAT416(0xff800000,
                                                               CONCAT412(0xff800000,
                                                                         CONCAT48(0xff800000,
                                                                                  0xff800000ff800000
                                                                                 )))))));
    auVar49 = ZEXT3264(local_26c0);
    auVar50 = ZEXT3264(local_26e0);
    auVar42 = ZEXT3264(local_2700);
    auVar51 = ZEXT3264(local_2720);
    bVar23 = true;
  }
  else {
    auVar27 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    bVar23 = (bool)((byte)(local_2744 >> 1) & 1);
    bVar22 = (bool)((byte)(local_2744 >> 2) & 1);
    bVar4 = (bool)((byte)(local_2744 >> 3) & 1);
    bVar5 = (bool)((byte)(local_2744 >> 4) & 1);
    bVar6 = (bool)((byte)(local_2744 >> 5) & 1);
    bVar7 = (bool)((byte)(local_2744 >> 6) & 1);
    bVar9 = (bool)((byte)(local_2744 >> 7) & 1);
    auVar49 = ZEXT3264(CONCAT428((uint)bVar9 * auVar27._28_4_ | (uint)!bVar9 * local_26c0._28_4_,
                                 CONCAT424((uint)bVar7 * auVar27._24_4_ |
                                           (uint)!bVar7 * local_26c0._24_4_,
                                           CONCAT420((uint)bVar6 * auVar27._20_4_ |
                                                     (uint)!bVar6 * local_26c0._20_4_,
                                                     CONCAT416((uint)bVar5 * auVar27._16_4_ |
                                                               (uint)!bVar5 * local_26c0._16_4_,
                                                               CONCAT412((uint)bVar4 *
                                                                         auVar27._12_4_ |
                                                                         (uint)!bVar4 *
                                                                         local_26c0._12_4_,
                                                                         CONCAT48((uint)bVar22 *
                                                                                  auVar27._8_4_ |
                                                                                  (uint)!bVar22 *
                                                                                  local_26c0._8_4_,
                                                                                  CONCAT44((uint)
                                                  bVar23 * auVar27._4_4_ |
                                                  (uint)!bVar23 * local_26c0._4_4_,
                                                  (uint)(bVar17 & 1) * auVar27._0_4_ |
                                                  (uint)!(bool)(bVar17 & 1) * local_26c0._0_4_))))))
                                ));
    bVar23 = false;
    auVar43 = ZEXT3264(local_2640);
    auVar44 = ZEXT3264(local_2660);
    auVar45 = ZEXT3264(local_2680);
    uVar24 = (ulong)local_2748;
    auVar46 = ZEXT3264(CONCAT428(0x7f800000,
                                 CONCAT424(0x7f800000,
                                           CONCAT420(0x7f800000,
                                                     CONCAT416(0x7f800000,
                                                               CONCAT412(0x7f800000,
                                                                         CONCAT48(0x7f800000,
                                                                                  0x7f8000007f800000
                                                                                 )))))));
    auVar47 = ZEXT3264(local_26a0);
    auVar48 = ZEXT3264(CONCAT428(0xff800000,
                                 CONCAT424(0xff800000,
                                           CONCAT420(0xff800000,
                                                     CONCAT416(0xff800000,
                                                               CONCAT412(0xff800000,
                                                                         CONCAT48(0xff800000,
                                                                                  0xff800000ff800000
                                                                                 )))))));
    auVar50 = ZEXT3264(local_26e0);
    auVar42 = ZEXT3264(local_2700);
    auVar51 = ZEXT3264(local_2720);
  }
LAB_007ba2ea:
  if (bVar23) {
    bVar17 = (byte)local_2744 & (byte)uVar24;
    bVar23 = (bool)(bVar17 >> 1 & 1);
    bVar22 = (bool)(bVar17 >> 2 & 1);
    bVar4 = (bool)(bVar17 >> 3 & 1);
    bVar5 = (bool)(bVar17 >> 4 & 1);
    bVar6 = (bool)(bVar17 >> 5 & 1);
    bVar7 = (bool)(bVar17 >> 6 & 1);
    *(uint *)local_2740 =
         (uint)(bVar17 & 1) * auVar48._0_4_ | (uint)!(bool)(bVar17 & 1) * *(int *)local_2740;
    *(uint *)(local_2740 + 4) =
         (uint)bVar23 * auVar48._4_4_ | (uint)!bVar23 * *(int *)(local_2740 + 4);
    *(uint *)(local_2740 + 8) =
         (uint)bVar22 * auVar48._8_4_ | (uint)!bVar22 * *(int *)(local_2740 + 8);
    *(uint *)(local_2740 + 0xc) =
         (uint)bVar4 * auVar48._12_4_ | (uint)!bVar4 * *(int *)(local_2740 + 0xc);
    *(uint *)(local_2740 + 0x10) =
         (uint)bVar5 * auVar48._16_4_ | (uint)!bVar5 * *(int *)(local_2740 + 0x10);
    *(uint *)(local_2740 + 0x14) =
         (uint)bVar6 * auVar48._20_4_ | (uint)!bVar6 * *(int *)(local_2740 + 0x14);
    *(uint *)(local_2740 + 0x18) =
         (uint)bVar7 * auVar48._24_4_ | (uint)!bVar7 * *(int *)(local_2740 + 0x18);
    *(uint *)(local_2740 + 0x1c) =
         (uint)(bVar17 >> 7) * auVar48._28_4_ |
         (uint)!(bool)(bVar17 >> 7) * *(int *)(local_2740 + 0x1c);
    return;
  }
  goto LAB_007ba1af;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }